

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv.cc
# Opt level: O2

void btree_str_kv_get_key(void *key,void *strbuf,size_t *len)

{
  ushort *puVar1;
  size_t __n;
  
  puVar1 = *key;
  if (puVar1 == (ushort *)0x0) {
    __n = 0;
  }
  else {
    __n = (size_t)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
    memcpy(strbuf,puVar1 + 1,__n);
  }
  *len = __n;
  return;
}

Assistant:

void btree_str_kv_get_key(void *key, void *strbuf, size_t *len)
{
    void *key_ptr;
    key_len_t keylen, inflen;
    key_len_t _keylen;

    memset(&inflen, 0xff, sizeof(key_len_t));

    memcpy(&key_ptr, key, sizeof(void *));
    if (key_ptr) {
        memcpy(&_keylen, key_ptr, sizeof(key_len_t));
        keylen = _endian_decode(_keylen);

        memcpy(strbuf, (uint8_t*)key_ptr + sizeof(key_len_t), keylen);
        *len = keylen;
    } else {
        *len = 0;
    }
}